

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 669_trimBinaryTree.cpp
# Opt level: O0

int main(void)

{
  TreeNode *pTVar1;
  TreeNode *pTVar2;
  TreeNode *root;
  
  pTVar1 = (TreeNode *)operator_new(0x18);
  TreeNode::TreeNode(pTVar1,1);
  pTVar2 = (TreeNode *)operator_new(0x18);
  TreeNode::TreeNode(pTVar2,0);
  pTVar1->left = pTVar2;
  pTVar2 = (TreeNode *)operator_new(0x18);
  TreeNode::TreeNode(pTVar2,2);
  pTVar1->right = pTVar2;
  pTVar1 = recur(pTVar1,1,2);
  printnode(pTVar1);
  return 0;
}

Assistant:

int main()
{
    TreeNode* root = new TreeNode(1);
    root->left = new TreeNode(0);
    root->right = new TreeNode(2);
    root = recur(root,1,2);
    printnode(root);
}